

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

int dtdCopy(DTD *newDtd,DTD *oldDtd,XML_Parser parser)

{
  undefined4 uVar1;
  int iVar2;
  NAMED *pNVar3;
  XML_Char *pXVar4;
  NAMED *pNVar5;
  KEY pXVar6;
  NAMED *pNVar7;
  ELEMENT_TYPE *oldE;
  XML_Char *name_2;
  ELEMENT_TYPE *newE;
  int i;
  ATTRIBUTE_ID *oldA;
  XML_Char *name_1;
  ATTRIBUTE_ID *newA;
  PREFIX *oldP;
  XML_Char *name;
  HASH_TABLE_ITER iter;
  XML_Parser parser_local;
  DTD *oldDtd_local;
  DTD *newDtd_local;
  
  iter.end = (NAMED **)parser;
  hashTableIterInit((HASH_TABLE_ITER *)&name,&oldDtd->prefixes);
  do {
    pNVar3 = hashTableIterNext((HASH_TABLE_ITER *)&name);
    if (pNVar3 == (NAMED *)0x0) {
      hashTableIterInit((HASH_TABLE_ITER *)&name,&oldDtd->attributeIds);
      while( true ) {
        pNVar3 = hashTableIterNext((HASH_TABLE_ITER *)&name);
        if (pNVar3 == (NAMED *)0x0) {
          hashTableIterInit((HASH_TABLE_ITER *)&name,&oldDtd->elementTypes);
          while( true ) {
            pNVar3 = hashTableIterNext((HASH_TABLE_ITER *)&name);
            if (pNVar3 == (NAMED *)0x0) {
              iVar2 = copyEntityTable(&newDtd->generalEntities,&newDtd->pool,
                                      &oldDtd->generalEntities,iter.end);
              if (iVar2 == 0) {
                newDtd_local._4_4_ = 0;
              }
              else {
                iVar2 = copyEntityTable(&newDtd->paramEntities,&newDtd->pool,&oldDtd->paramEntities,
                                        iter.end);
                if (iVar2 == 0) {
                  newDtd_local._4_4_ = 0;
                }
                else {
                  newDtd->complete = oldDtd->complete;
                  newDtd->standalone = oldDtd->standalone;
                  newDtd->in_eldecl = oldDtd->in_eldecl;
                  newDtd->scaffold = oldDtd->scaffold;
                  newDtd->contentStringLen = oldDtd->contentStringLen;
                  newDtd->scaffSize = oldDtd->scaffSize;
                  newDtd->scaffLevel = oldDtd->scaffLevel;
                  newDtd->scaffIndex = oldDtd->scaffIndex;
                  newDtd_local._4_4_ = 1;
                }
              }
              return newDtd_local._4_4_;
            }
            pXVar4 = poolCopyString(&newDtd->pool,pNVar3->name);
            if (pXVar4 == (XML_Char *)0x0) break;
            pNVar5 = lookup(&newDtd->elementTypes,pXVar4,0x28);
            if (pNVar5 == (NAMED *)0x0) {
              return 0;
            }
            if (*(int *)&pNVar3[3].name != 0) {
              pXVar6 = (KEY)(*(code *)iter.end[3])((long)*(int *)&pNVar3[3].name * 0x18);
              pNVar5[4].name = pXVar6;
              if (pNVar5[4].name == (KEY)0x0) {
                return 0;
              }
            }
            if (pNVar3[2].name != (KEY)0x0) {
              pNVar7 = lookup(&newDtd->attributeIds,*(KEY *)pNVar3[2].name,0);
              pNVar5[2].name = (KEY)pNVar7;
            }
            uVar1 = *(undefined4 *)&pNVar3[3].name;
            *(undefined4 *)&pNVar5[3].name = uVar1;
            *(undefined4 *)((long)&pNVar5[3].name + 4) = uVar1;
            if (pNVar3[1].name != (KEY)0x0) {
              pNVar7 = lookup(&newDtd->prefixes,*(KEY *)pNVar3[1].name,0);
              pNVar5[1].name = (KEY)pNVar7;
            }
            for (newE._4_4_ = 0; newE._4_4_ < *(int *)&pNVar5[3].name; newE._4_4_ = newE._4_4_ + 1)
            {
              pNVar7 = lookup(&newDtd->attributeIds,
                              (KEY)**(undefined8 **)(pNVar3[4].name + (long)newE._4_4_ * 0x18),0);
              *(NAMED **)(pNVar5[4].name + (long)newE._4_4_ * 0x18) = pNVar7;
              pNVar5[4].name[(long)newE._4_4_ * 0x18 + 8] =
                   pNVar3[4].name[(long)newE._4_4_ * 0x18 + 8];
              if (*(long *)(pNVar3[4].name + (long)newE._4_4_ * 0x18 + 0x10) == 0) {
                pXVar6 = pNVar5[4].name + (long)newE._4_4_ * 0x18 + 0x10;
                pXVar6[0] = '\0';
                pXVar6[1] = '\0';
                pXVar6[2] = '\0';
                pXVar6[3] = '\0';
                pXVar6[4] = '\0';
                pXVar6[5] = '\0';
                pXVar6[6] = '\0';
                pXVar6[7] = '\0';
              }
              else {
                pXVar4 = poolCopyString(&newDtd->pool,
                                        *(XML_Char **)
                                         (pNVar3[4].name + (long)newE._4_4_ * 0x18 + 0x10));
                *(XML_Char **)(pNVar5[4].name + (long)newE._4_4_ * 0x18 + 0x10) = pXVar4;
                if (*(long *)(pNVar5[4].name + (long)newE._4_4_ * 0x18 + 0x10) == 0) {
                  return 0;
                }
              }
            }
          }
          return 0;
        }
        if (((newDtd->pool).ptr == (newDtd->pool).end) &&
           (iVar2 = poolGrow(&newDtd->pool), iVar2 == 0)) break;
        pXVar4 = (newDtd->pool).ptr;
        (newDtd->pool).ptr = pXVar4 + 1;
        *pXVar4 = '\0';
        pXVar4 = poolCopyString(&newDtd->pool,pNVar3->name);
        if (pXVar4 == (XML_Char *)0x0) {
          return 0;
        }
        pNVar5 = lookup(&newDtd->attributeIds,pXVar4 + 1,0x18);
        if (pNVar5 == (NAMED *)0x0) {
          return 0;
        }
        *(undefined1 *)&pNVar5[2].name = *(undefined1 *)&pNVar3[2].name;
        if (pNVar3[1].name != (KEY)0x0) {
          *(undefined1 *)((long)&pNVar5[2].name + 1) = *(undefined1 *)((long)&pNVar3[2].name + 1);
          if ((PREFIX *)pNVar3[1].name == &oldDtd->defaultPrefix) {
            pNVar5[1].name = (KEY)&newDtd->defaultPrefix;
          }
          else {
            pNVar3 = lookup(&newDtd->prefixes,*(KEY *)pNVar3[1].name,0);
            pNVar5[1].name = (KEY)pNVar3;
          }
        }
      }
      return 0;
    }
    pXVar4 = poolCopyString(&newDtd->pool,pNVar3->name);
    if (pXVar4 == (XML_Char *)0x0) {
      return 0;
    }
    pNVar3 = lookup(&newDtd->prefixes,pXVar4,0x10);
  } while (pNVar3 != (NAMED *)0x0);
  return 0;
}

Assistant:

static int dtdCopy(DTD *newDtd, const DTD *oldDtd, XML_Parser parser)
{
  HASH_TABLE_ITER iter;

  /* Copy the prefix table. */

  hashTableIterInit(&iter, &(oldDtd->prefixes));
  for (;;) {
    const XML_Char *name;
    const PREFIX *oldP = (PREFIX *)hashTableIterNext(&iter);
    if (!oldP)
      break;
    name = poolCopyString(&(newDtd->pool), oldP->name);
    if (!name)
      return 0;
    if (!lookup(&(newDtd->prefixes), name, sizeof(PREFIX)))
      return 0;
  }

  hashTableIterInit(&iter, &(oldDtd->attributeIds));

  /* Copy the attribute id table. */

  for (;;) {
    ATTRIBUTE_ID *newA;
    const XML_Char *name;
    const ATTRIBUTE_ID *oldA = (ATTRIBUTE_ID *)hashTableIterNext(&iter);

    if (!oldA)
      break;
    /* Remember to allocate the scratch byte before the name. */
    if (!poolAppendChar(&(newDtd->pool), XML_T('\0')))
      return 0;
    name = poolCopyString(&(newDtd->pool), oldA->name);
    if (!name)
      return 0;
    ++name;
    newA = (ATTRIBUTE_ID *)lookup(&(newDtd->attributeIds), name, sizeof(ATTRIBUTE_ID));
    if (!newA)
      return 0;
    newA->maybeTokenized = oldA->maybeTokenized;
    if (oldA->prefix) {
      newA->xmlns = oldA->xmlns;
      if (oldA->prefix == &oldDtd->defaultPrefix)
        newA->prefix = &newDtd->defaultPrefix;
      else
        newA->prefix = (PREFIX *)lookup(&(newDtd->prefixes), oldA->prefix->name, 0);
    }
  }

  /* Copy the element type table. */

  hashTableIterInit(&iter, &(oldDtd->elementTypes));

  for (;;) {
    int i;
    ELEMENT_TYPE *newE;
    const XML_Char *name;
    const ELEMENT_TYPE *oldE = (ELEMENT_TYPE *)hashTableIterNext(&iter);
    if (!oldE)
      break;
    name = poolCopyString(&(newDtd->pool), oldE->name);
    if (!name)
      return 0;
    newE = (ELEMENT_TYPE *)lookup(&(newDtd->elementTypes), name, sizeof(ELEMENT_TYPE));
    if (!newE)
      return 0;
    if (oldE->nDefaultAtts) {
      newE->defaultAtts = (DEFAULT_ATTRIBUTE *)MALLOC(oldE->nDefaultAtts * sizeof(DEFAULT_ATTRIBUTE));
      if (!newE->defaultAtts)
        return 0;
    }
    if (oldE->idAtt)
      newE->idAtt = (ATTRIBUTE_ID *)lookup(&(newDtd->attributeIds), oldE->idAtt->name, 0);
    newE->allocDefaultAtts = newE->nDefaultAtts = oldE->nDefaultAtts;
    if (oldE->prefix)
      newE->prefix = (PREFIX *)lookup(&(newDtd->prefixes), oldE->prefix->name, 0);
    for (i = 0; i < newE->nDefaultAtts; i++) {
      newE->defaultAtts[i].id = (ATTRIBUTE_ID *)lookup(&(newDtd->attributeIds), oldE->defaultAtts[i].id->name, 0);
      newE->defaultAtts[i].isCdata = oldE->defaultAtts[i].isCdata;
      if (oldE->defaultAtts[i].value) {
        newE->defaultAtts[i].value = poolCopyString(&(newDtd->pool), oldE->defaultAtts[i].value);
        if (!newE->defaultAtts[i].value)
          return 0;
      }
      else
        newE->defaultAtts[i].value = 0;
    }
  }

  /* Copy the entity tables. */
  if (!copyEntityTable(&(newDtd->generalEntities),
                       &(newDtd->pool),
                       &(oldDtd->generalEntities), parser))
      return 0;

#ifdef XML_DTD
  if (!copyEntityTable(&(newDtd->paramEntities),
                       &(newDtd->pool),
                       &(oldDtd->paramEntities), parser))
      return 0;
#endif /* XML_DTD */

  newDtd->complete = oldDtd->complete;
  newDtd->standalone = oldDtd->standalone;

  /* Don't want deep copying for scaffolding */
  newDtd->in_eldecl = oldDtd->in_eldecl;
  newDtd->scaffold = oldDtd->scaffold;
  newDtd->contentStringLen = oldDtd->contentStringLen;
  newDtd->scaffSize = oldDtd->scaffSize;
  newDtd->scaffLevel = oldDtd->scaffLevel;
  newDtd->scaffIndex = oldDtd->scaffIndex;

  return 1;
}